

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O1

pair<jbcoin::PublicKey,_jbcoin::SecretKey> *
jbcoin::randomKeyPair
          (pair<jbcoin::PublicKey,_jbcoin::SecretKey> *__return_storage_ptr__,KeyType type)

{
  SecretKey sk;
  SecretKey local_68;
  PublicKey local_48;
  
  randomSecretKey();
  derivePublicKey(&local_48,type,&local_68);
  (__return_storage_ptr__->first).size_ = local_48.size_;
  memcpy((__return_storage_ptr__->first).buf_,local_48.buf_,local_48.size_);
  *(undefined8 *)(__return_storage_ptr__->second).buf_ = local_68.buf_._0_8_;
  *(undefined8 *)((__return_storage_ptr__->second).buf_ + 8) = local_68.buf_._8_8_;
  *(undefined8 *)((__return_storage_ptr__->second).buf_ + 0x10) = local_68.buf_._16_8_;
  *(undefined8 *)((__return_storage_ptr__->second).buf_ + 0x18) = local_68.buf_._24_8_;
  beast::secure_erase<void>(&local_68,0x20);
  return __return_storage_ptr__;
}

Assistant:

std::pair<PublicKey, SecretKey>
randomKeyPair (KeyType type)
{
    auto const sk = randomSecretKey();
    return { derivePublicKey(type, sk), sk };
}